

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O3

void ll_grammar::clear_null
               (vector<int,_std::allocator<int>_> *a,vector<int,_std::allocator<int>_> *result,
               int value)

{
  iterator __position;
  pointer piVar1;
  long lVar2;
  ulong uVar3;
  
  piVar1 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (a->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((a->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (*(int *)((long)piVar1 + lVar2) != value) {
        __position._M_current =
             (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (__position._M_current ==
            (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)result,__position,
                     (int *)((long)piVar1 + lVar2));
          piVar1 = (a->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          *__position._M_current = *(int *)((long)piVar1 + lVar2);
          (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 4;
    } while (uVar3 < (ulong)((long)(a->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2));
  }
  return;
}

Assistant:

void ll_grammar::clear_null(const vector<int>& a, vector<int>& result, int value ){
    result.clear();
    for (int i = 0; i < a.size(); i++){
        if (a[i] != value){
            result.push_back(a[i]);
        }
    }

}